

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
GetPropertyEquivalenceInfo
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  PropertyIndex PVar5;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord_local;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSStack_20;
  int i;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  ushort uVar6;
  
  local_30 = propertyRecord;
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_30,&stack0xffffffffffffffe0,
                     (int *)((long)&propertyRecord_local + 4));
  if (bVar4) {
    bVar1 = pSStack_20->Attributes;
    if ((bVar1 & 8) == 0) {
      uVar2 = pSStack_20->propertyIndex;
      if (uVar2 == 0xffff) {
        PVar5 = 0xffff;
      }
      else {
        uVar3 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
        uVar6 = -uVar3;
        if (uVar2 < uVar3) {
          uVar6 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
        }
        PVar5 = uVar6 + uVar2;
      }
      info->slotIndex = PVar5;
      info->isAuxSlot = (this->super_DynamicTypeHandler).inlineSlotCapacity < uVar2;
      info->isWritable = (bool)(bVar1 >> 2 & 1);
      goto LAB_00de3ae2;
    }
  }
  info->slotIndex = 0xffff;
  info->isAuxSlot = false;
  info->isWritable = false;
LAB_00de3ae2:
  return info->slotIndex != 0xffff;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            Js::PropertyIndex absSlotIndex = DisallowBigPropertyIndex(descriptor->propertyIndex);
            info.slotIndex = AdjustSlotIndexForInlineSlots(absSlotIndex);
            info.isAuxSlot = absSlotIndex > GetInlineSlotCapacity();
            info.isWritable = !!(descriptor->Attributes & PropertyWritable);
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isAuxSlot = false;
            info.isWritable = false;
        }
        return info.slotIndex != Constants::NoSlot;
    }